

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::GetValuesOrEntries
              (RecyclableObject *object,bool valuesToReturn,ScriptContext *scriptContext)

{
  code *pcVar1;
  undefined4 itemIndex;
  bool bVar2;
  int iVar3;
  PropertyId propertyId_00;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptLibrary *pJVar6;
  undefined4 extraout_var;
  JavascriptArray *pJVar7;
  Var pvVar8;
  JavascriptArray *entry;
  Var value;
  PropertyDescriptor propertyDescriptor;
  uint local_50;
  uint32 index;
  uint32 i;
  PropertyId propertyId;
  PropertyRecord *propertyRecord;
  Var nextKey;
  JavascriptArray *pJStack_30;
  uint32 length;
  JavascriptArray *ownKeysResult;
  JavascriptArray *valuesArray;
  ScriptContext *scriptContext_local;
  RecyclableObject *pRStack_10;
  bool valuesToReturn_local;
  RecyclableObject *object_local;
  
  valuesArray = (JavascriptArray *)scriptContext;
  scriptContext_local._7_1_ = valuesToReturn;
  pRStack_10 = object;
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x45d,"(object != nullptr)","object != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (valuesArray == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x45e,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pJVar6 = ScriptContext::GetLibrary((ScriptContext *)valuesArray);
  ownKeysResult = JavascriptLibrary::CreateArray(pJVar6,0);
  pJStack_30 = Js::JavascriptOperators::GetOwnPropertyNames(pRStack_10,(ScriptContext *)valuesArray)
  ;
  nextKey._4_4_ = ArrayObject::GetLength(&pJStack_30->super_ArrayObject);
  _i = (PropertyRecord *)0x0;
  local_50 = 0;
  propertyDescriptor._44_4_ = 0;
  do {
    if (nextKey._4_4_ <= local_50) {
      return ownKeysResult;
    }
    iVar3 = (*(pJStack_30->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pJStack_30,(ulong)local_50);
    propertyRecord = (PropertyRecord *)CONCAT44(extraout_var,iVar3);
    bVar2 = VarIs<Js::JavascriptString>(propertyRecord);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x46a,"(VarIs<JavascriptString>(nextKey))",
                                  "VarIs<JavascriptString>(nextKey)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&value);
    JavascriptConversion::ToPropertyKey
              (propertyRecord,(ScriptContext *)valuesArray,(PropertyRecord **)&i,
               (PropertyString **)0x0);
    propertyId_00 = PropertyRecord::GetPropertyId(_i);
    if (propertyId_00 == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x470,"(propertyId != Constants::NoProperty)",
                                  "propertyId != Constants::NoProperty");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    BVar4 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                      (pRStack_10,propertyId_00,(ScriptContext *)valuesArray,
                       (PropertyDescriptor *)&value);
    if ((BVar4 != 0) &&
       (bVar2 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)&value), bVar2)) {
      pJVar7 = (JavascriptArray *)
               Js::JavascriptOperators::GetProperty
                         (pRStack_10,propertyId_00,(ScriptContext *)valuesArray,
                          (PropertyValueInfo *)0x0);
      entry = pJVar7;
      if ((scriptContext_local._7_1_ & 1) == 0) {
        pJVar6 = ScriptContext::GetLibrary((ScriptContext *)valuesArray);
        entry = JavascriptLibrary::CreateArray(pJVar6,2);
        pvVar8 = CrossSite::MarshalVar((ScriptContext *)valuesArray,propertyRecord,false);
        Js::JavascriptArray::DirectSetItemAt<void*>(entry,0,pvVar8);
        pvVar8 = CrossSite::MarshalVar((ScriptContext *)valuesArray,pJVar7,false);
        Js::JavascriptArray::DirectSetItemAt<void*>(entry,1,pvVar8);
      }
      pJVar7 = ownKeysResult;
      itemIndex = propertyDescriptor._44_4_;
      propertyDescriptor._44_4_ = propertyDescriptor._44_4_ + 1;
      pvVar8 = CrossSite::MarshalVar((ScriptContext *)valuesArray,entry,false);
      Js::JavascriptArray::DirectSetItemAt<void*>(pJVar7,itemIndex,pvVar8);
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

Var JavascriptObject::GetValuesOrEntries(RecyclableObject* object, bool valuesToReturn, ScriptContext* scriptContext)
{
    Assert(object != nullptr);
    Assert(scriptContext != nullptr);
    JavascriptArray* valuesArray = scriptContext->GetLibrary()->CreateArray(0);

    JavascriptArray* ownKeysResult = JavascriptOperators::GetOwnPropertyNames(object, scriptContext);
    uint32 length = ownKeysResult->GetLength();

    Var nextKey;
    const PropertyRecord* propertyRecord = nullptr;
    PropertyId propertyId;
    for (uint32 i = 0, index = 0; i < length; i++)
    {
        nextKey = ownKeysResult->DirectGetItem(i);
        Assert(VarIs<JavascriptString>(nextKey));

        PropertyDescriptor propertyDescriptor;

        JavascriptConversion::ToPropertyKey(nextKey, scriptContext, &propertyRecord, nullptr);
        propertyId = propertyRecord->GetPropertyId();
        Assert(propertyId != Constants::NoProperty);

        if (JavascriptOperators::GetOwnPropertyDescriptor(object, propertyId, scriptContext, &propertyDescriptor))
        {
            if (propertyDescriptor.IsEnumerable())
            {
                Var value = JavascriptOperators::GetProperty(object, propertyId, scriptContext);

                if (!valuesToReturn)
                {
                    // For Object.entries each entry is key, value pair
                    JavascriptArray* entry = scriptContext->GetLibrary()->CreateArray(2);
                    entry->DirectSetItemAt(0, CrossSite::MarshalVar(scriptContext, nextKey));
                    entry->DirectSetItemAt(1, CrossSite::MarshalVar(scriptContext, value));
                    value = entry;
                }
                valuesArray->DirectSetItemAt(index++, CrossSite::MarshalVar(scriptContext, value));
            }
        }
    }

    return valuesArray;
}